

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O1

int Parser_processAttribute(Parser *xmlParser,IXML_Node *node)

{
  ixml_membuf *m;
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  ptrdiff_t pVar5;
  char *pcVar6;
  long len;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ptrdiff_t tlen;
  ptrdiff_t local_38;
  
  local_38 = 0;
  pcVar4 = (xmlParser->tokenBuf).buf;
  uVar7 = 0xc;
  if (pcVar4 == (char *)0x0) {
    iVar2 = 0x781;
  }
  else {
    m = &xmlParser->tokenBuf;
    iVar2 = Parser_UTF8ToInt(pcVar4,&local_38);
    iVar10 = 0;
    iVar9 = 0xce;
    do {
      iVar8 = (iVar10 + iVar9) / 2;
      if (iVar2 < (int)(uint)Letter[iVar8].l) {
        iVar9 = iVar8 + -1;
      }
      else {
        if (iVar2 <= (int)(uint)Letter[iVar8].h) {
          pcVar4 = strdup(pcVar4);
          node->nodeName = pcVar4;
          if (pcVar4 == (char *)0x0) {
            iVar2 = 0x78d;
            goto LAB_00126b61;
          }
          pVar5 = Parser_getNextToken(xmlParser);
          if (pVar5 == 0) {
            iVar2 = 0x793;
            goto LAB_00126a45;
          }
          iVar2 = 0x79a;
          if (*m->buf != '=') goto LAB_00126a45;
          pVar5 = Parser_getNextToken(xmlParser);
          if (pVar5 == 0) {
            iVar2 = 0x7a0;
            goto LAB_00126a45;
          }
          cVar1 = *m->buf;
          if ((cVar1 != '\'') && (iVar2 = 0x7a7, cVar1 != '\"')) goto LAB_00126a45;
          pcVar4 = xmlParser->curPtr;
          pcVar6 = strstr(pcVar4,m->buf);
          if (pcVar6 != (char *)0x0) {
            if (pcVar4 < pcVar6) goto LAB_00126afb;
            goto LAB_00126b0d;
          }
          iVar2 = 0x7ad;
          goto LAB_00126a45;
        }
        iVar10 = iVar8 + 1;
      }
    } while (iVar10 <= iVar9);
    iVar2 = 0x786;
  }
  goto LAB_00126a45;
  while (pcVar4 = pcVar4 + 1, pcVar4 != pcVar6) {
LAB_00126afb:
    if (*pcVar4 == '<') {
      iVar2 = 0x7b6;
      goto LAB_00126a45;
    }
  }
LAB_00126b0d:
  ixml_membuf_destroy(m);
  len = (long)pcVar6 - (long)xmlParser->curPtr;
  if (len != 0) {
    iVar9 = Parser_copyToken(xmlParser,xmlParser->curPtr,len);
    iVar2 = 0x7c6;
    if (iVar9 != 0) goto LAB_00126a45;
  }
  xmlParser->curPtr = pcVar6 + 1;
  pcVar4 = (xmlParser->tokenBuf).buf;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = (char *)malloc(1);
    node->nodeValue = pcVar4;
    *pcVar4 = '\0';
  }
  else {
    pcVar4 = strdup(pcVar4);
    node->nodeValue = pcVar4;
    if (pcVar4 == (char *)0x0) {
      iVar2 = 0x7d2;
LAB_00126b61:
      uVar7 = 0x66;
      goto LAB_00126a45;
    }
  }
  node->nodeType = eATTRIBUTE_NODE;
  uVar3 = Parser_xmlNamespace(xmlParser,node);
  if (uVar3 == 0) {
    xmlParser->savePtr = xmlParser->curPtr;
    pVar5 = Parser_getNextToken(xmlParser);
    if (pVar5 == 0) {
      iVar2 = 0x7e7;
    }
    else {
      pcVar4 = m->buf;
      iVar2 = strcmp(pcVar4,"<");
      if (iVar2 == 0) {
        iVar2 = 0x7ee;
        uVar7 = 0x6a;
      }
      else {
        iVar2 = strcmp(pcVar4,">");
        if (iVar2 == 0) {
          xmlParser->state = eCONTENT;
        }
        else {
          xmlParser->curPtr = xmlParser->savePtr;
        }
        uVar7 = 0;
        iVar2 = 0;
      }
    }
  }
  else {
    iVar2 = 0x7e0;
    uVar7 = uVar3;
  }
LAB_00126a45:
  if ((uVar7 != 0) && (uVar7 != 0x68)) {
    IxmlPrintf("/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
               ,iVar2,"Parser_processAttribute","Error %d\n",(ulong)uVar7);
  }
  return uVar7;
}

Assistant:

static int Parser_processAttribute(
	/*! [in] The XML parser. */
	Parser *xmlParser,
	/*! [in] The Node to process. */
	IXML_Node *node)
{
	int ret = IXML_SUCCESS;
	int line = 0;
	ptrdiff_t tlen = 0;
	char *strEndQuote = NULL;
	char *pCur = NULL;
	char *pCurToken = NULL;

	assert(xmlParser);

	if (xmlParser == NULL) {
		ret = IXML_FAILED;
		line = __LINE__;
		goto ExitFunction;
	}
	pCurToken = xmlParser->tokenBuf.buf;
	if (pCurToken == NULL) {
		ret = IXML_SYNTAX_ERR;
		line = __LINE__;
		goto ExitFunction;
	}
	if (Parser_isNameChar(Parser_UTF8ToInt(pCurToken, &tlen), 0) == 0) {
		ret = IXML_SYNTAX_ERR;
		line = __LINE__;
		goto ExitFunction;
	}
	/* copy in the attribute name */
	node->nodeName = safe_strdup(pCurToken);
	if (node->nodeName == NULL) {
		ret = IXML_INSUFFICIENT_MEMORY;
		line = __LINE__;
		goto ExitFunction;
	}
	/* read in the "=" sign */
	if (Parser_getNextToken(xmlParser) == 0) {
		ret = IXML_SYNTAX_ERR;
		line = __LINE__;
		goto ExitFunction;
	}

	pCurToken = xmlParser->tokenBuf.buf;
	if (*pCurToken != EQUALS) {
		ret = IXML_SYNTAX_ERR;
		line = __LINE__;
		goto ExitFunction;
	}
	/* read in the single quote or double quote */
	if (Parser_getNextToken(xmlParser) == 0) {
		ret = IXML_SYNTAX_ERR;
		line = __LINE__;
		goto ExitFunction;
	}
	/* pCurToken is either quote or single quote */
	pCurToken = (xmlParser->tokenBuf).buf;
	if (*pCurToken != QUOTE && *pCurToken != SINGLEQUOTE) {
		ret = IXML_SYNTAX_ERR;
		line = __LINE__;
		goto ExitFunction;
	}
	strEndQuote = strstr(xmlParser->curPtr, pCurToken);
	if (strEndQuote == NULL) {
		ret = IXML_SYNTAX_ERR;
		line = __LINE__;
		goto ExitFunction;
	}
	/* check between curPtr and strEndQuote,
	 * whether there are illegal chars. */
	pCur = xmlParser->curPtr;
	while (pCur < strEndQuote) {
		if (*pCur == '<') {
			ret = IXML_SYNTAX_ERR;
			line = __LINE__;
			goto ExitFunction;
		}
		/*if (*pCur == '&') {
			Parser_parseReference(++pCur);
		}*/
		pCur++;
	}
	/* clear token buffer */
	Parser_clearTokenBuf(xmlParser);
	if (strEndQuote != xmlParser->curPtr) {
		ret = Parser_copyToken(xmlParser,
			xmlParser->curPtr,
			strEndQuote - xmlParser->curPtr);
		if (ret != IXML_SUCCESS) {
			ret = IXML_SYNTAX_ERR;
			line = __LINE__;
			goto ExitFunction;
		}
	}
	/* skip the ending quote */
	xmlParser->curPtr = strEndQuote + 1;
	pCurToken = xmlParser->tokenBuf.buf;
	if (pCurToken != NULL) {
		/* attribute has value, like a="c" */
		node->nodeValue = safe_strdup(pCurToken);
		if (node->nodeValue == NULL) {
			ret = IXML_INSUFFICIENT_MEMORY;
			line = __LINE__;
			goto ExitFunction;
		}
	} else {
		/* if attribute doesn't have value, like a=""
		 * somewhere on other places is this copied */
		node->nodeValue = malloc(sizeof(char));
		*(node->nodeValue) = '\0';
	}
	node->nodeType = eATTRIBUTE_NODE;

	/* check whether this is a new namespace definition */
	ret = Parser_xmlNamespace(xmlParser, node);
	if (ret != IXML_SUCCESS) {
		line = __LINE__;
		goto ExitFunction;
	}
	/* read ahead to see whether we have more attributes */
	xmlParser->savePtr = xmlParser->curPtr;
	if (Parser_getNextToken(xmlParser) == 0) {
		ret = IXML_SYNTAX_ERR;
		line = __LINE__;
		goto ExitFunction;
	}

	pCurToken = xmlParser->tokenBuf.buf;
	if (strcmp(pCurToken, "<") == 0) {
		ret = IXML_FAILED;
		line = __LINE__;
		goto ExitFunction;
	} else if (strcmp(pCurToken, ">") != 0) {
		/* more attribute? */
		/* backup */
		xmlParser->curPtr = xmlParser->savePtr;
	} else {
		xmlParser->state = eCONTENT;
	}

ExitFunction:
	if (ret != IXML_SUCCESS && ret != IXML_FILE_DONE) {
		IxmlPrintf(__FILE__,
			line,
			"Parser_processAttribute",
			"Error %d\n",
			ret);
	}

	return ret;
}